

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsNumberToDouble(JsValueRef value,double *asDouble)

{
  bool bVar1;
  double dVar2;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  double *asDouble_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asDouble == (double *)0x0) {
    return JsErrorNullArgument;
  }
  __debugCheckNoException = (DebugCheckNoException)asDouble;
  DebugCheckNoException::DebugCheckNoException(&local_28);
  bVar1 = Js::TaggedInt::Is(value);
  if (bVar1) {
    dVar2 = Js::TaggedInt::ToDouble(value);
    *(double *)__debugCheckNoException = dVar2;
  }
  else {
    bVar1 = Js::JavascriptNumber::Is_NoTaggedIntCheck(value);
    if (!bVar1) {
      *(undefined8 *)__debugCheckNoException = 0;
      value_local._4_4_ = JsErrorInvalidArgument;
      bVar1 = true;
      goto LAB_004006f1;
    }
    dVar2 = Js::JavascriptNumber::GetValue(value);
    *(double *)__debugCheckNoException = dVar2;
  }
  bVar1 = false;
LAB_004006f1:
  local_28.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_28);
  if (!bVar1) {
    value_local._4_4_ = JsNoError;
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsNumberToDouble(_In_ JsValueRef value, _Out_ double *asDouble)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asDouble);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asDouble = Js::TaggedInt::ToDouble(value);
        }